

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileMtlImporter.cpp
# Opt level: O2

void __thiscall Assimp::ObjFileMtlImporter::createMaterial(ObjFileMtlImporter *this)

{
  mapped_type pMVar1;
  Model *pMVar2;
  uint uVar3;
  byte *pbVar4;
  long lVar5;
  iterator iVar6;
  Material *pMVar7;
  mapped_type *ppMVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  token;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string line;
  string local_40 [32];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&line,"",(allocator<char> *)&name);
  pbVar4 = (byte *)(this->m_DataIt)._M_current;
  while ((0xd < *pbVar4 || ((0x3401U >> (*pbVar4 & 0x1f) & 1) == 0))) {
    std::__cxx11::string::push_back((char)&line);
    pbVar4 = (byte *)((this->m_DataIt)._M_current + 1);
    (this->m_DataIt)._M_current = (char *)pbVar4;
  }
  token.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  token.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  token.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name," \t",(allocator<char> *)&local_80);
  uVar3 = tokenize<std::__cxx11::string>(&line,&token,&name);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"",(allocator<char> *)&local_80);
  if (uVar3 == 1) {
    std::__cxx11::string::assign((char *)&name);
  }
  else {
    std::__cxx11::string::find_first_of((char *)&line,0x5bb7ff);
    lVar5 = std::__cxx11::string::find_first_not_of((char *)&line,0x5bb7ff);
    if (lVar5 != -1) {
      std::__cxx11::string::substr((ulong)&local_80,(ulong)&line);
      std::__cxx11::string::operator=((string *)&name,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
  }
  std::__cxx11::string::string(local_40,(string *)&name);
  trim_whitespaces<std::__cxx11::string>(&local_80,(Assimp *)local_40,str);
  std::__cxx11::string::operator=((string *)&name,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string(local_40);
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>_>
          ::find(&(this->m_pModel->m_MaterialMap)._M_t,&name);
  if (&(this->m_pModel->m_MaterialMap)._M_t._M_impl.super__Rb_tree_header ==
      (_Rb_tree_header *)iVar6._M_node) {
    pMVar7 = (Material *)operator_new(0x409c);
    ObjFile::Material::Material(pMVar7);
    this->m_pModel->m_pCurrentMaterial = pMVar7;
    if (name._M_string_length < 0x400) {
      pMVar7 = this->m_pModel->m_pCurrentMaterial;
      (pMVar7->MaterialName).length = (ai_uint32)name._M_string_length;
      memcpy((pMVar7->MaterialName).data,name._M_dataplus._M_p,name._M_string_length);
      (pMVar7->MaterialName).data[name._M_string_length] = '\0';
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->m_pModel->m_MaterialLib,&name);
    pMVar1 = this->m_pModel->m_pCurrentMaterial;
    ppMVar8 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>_>
              ::operator[](&this->m_pModel->m_MaterialMap,&name);
    *ppMVar8 = pMVar1;
    pMVar2 = this->m_pModel;
    if (pMVar2->m_pCurrentMesh != (Mesh *)0x0) {
      pMVar2->m_pCurrentMesh->m_uiMaterialIndex =
           (int)((ulong)((long)(pMVar2->m_MaterialLib).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pMVar2->m_MaterialLib).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
    }
  }
  else {
    this->m_pModel->m_pCurrentMaterial = *(Material **)(iVar6._M_node + 2);
  }
  std::__cxx11::string::~string((string *)&name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&token);
  std::__cxx11::string::~string((string *)&line);
  return;
}

Assistant:

void ObjFileMtlImporter::createMaterial()
{
    std::string line( "" );
    while( !IsLineEnd( *m_DataIt ) ) {
        line += *m_DataIt;
        ++m_DataIt;
    }

    std::vector<std::string> token;
    const unsigned int numToken = tokenize<std::string>( line, token, " \t" );
    std::string name( "" );
    if ( numToken == 1 ) {
        name = AI_DEFAULT_MATERIAL_NAME;
    } else {
        // skip newmtl and all following white spaces
        std::size_t first_ws_pos = line.find_first_of(" \t");
        std::size_t first_non_ws_pos = line.find_first_not_of(" \t", first_ws_pos);
        if (first_non_ws_pos != std::string::npos) {
            name = line.substr(first_non_ws_pos);
        }
    }

    name = trim_whitespaces(name);

    std::map<std::string, ObjFile::Material*>::iterator it = m_pModel->m_MaterialMap.find( name );
    if ( m_pModel->m_MaterialMap.end() == it) {
        // New Material created
        m_pModel->m_pCurrentMaterial = new ObjFile::Material();
        m_pModel->m_pCurrentMaterial->MaterialName.Set( name );
        m_pModel->m_MaterialLib.push_back( name );
        m_pModel->m_MaterialMap[ name ] = m_pModel->m_pCurrentMaterial;

        if (m_pModel->m_pCurrentMesh) {
            m_pModel->m_pCurrentMesh->m_uiMaterialIndex = static_cast<unsigned int>(m_pModel->m_MaterialLib.size() - 1);
        }
    } else {
        // Use older material
        m_pModel->m_pCurrentMaterial = (*it).second;
    }
}